

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall fnv_hash_check::test_method(fnv_hash_check *this)

{
  uint32_t expected;
  undefined4 local_134;
  undefined1 local_130;
  undefined8 local_128;
  shared_count sStack_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  undefined **local_e8;
  undefined1 local_e0;
  undefined8 *local_d8;
  char *local_d0;
  undefined **local_c8;
  undefined1 local_c0;
  undefined ***local_b8;
  uint32_t *local_b0;
  undefined **local_a8;
  undefined1 local_a0;
  undefined ***local_98;
  char *local_90;
  undefined **local_88;
  undefined1 local_80;
  undefined ***local_78;
  char *local_70;
  undefined **local_68;
  undefined1 local_60;
  undefined ***local_58;
  undefined4 *local_50;
  undefined **local_48;
  undefined1 local_40;
  undefined ***local_38;
  char *local_30;
  
  expected = 0xd39f0e56;
  local_134 = 0xd39f0e56;
  local_f8 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f8,0x72);
  local_130 = 1;
  local_128 = 0;
  sStack_120.pi_ = (sp_counted_base *)0x0;
  local_b8 = &local_e8;
  local_e0 = 0;
  local_e8 = &PTR__lazy_ostream_0013a758;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = "\nexpected: ";
  local_98 = &local_c8;
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_0013a798;
  local_78 = &local_a8;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_0013a7d8;
  local_90 = "\n";
  local_58 = &local_88;
  local_80 = 0;
  local_88 = &PTR__lazy_ostream_0013a818;
  local_70 = "actual: ";
  local_38 = &local_68;
  local_60 = 0;
  local_68 = &PTR__lazy_ostream_0013a858;
  local_40 = 0;
  local_48 = &PTR__lazy_ostream_0013a898;
  local_30 = "\n";
  local_118 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_110 = "";
  local_b0 = &expected;
  local_50 = &local_134;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_120);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(fnv_hash_check) {
	uint32_t x = 1235U;
	const uint32_t
			y = 9999999U,
			expected = (FNV_PRIME * x) ^y;

	x = fnv_hash(x, y);

	BOOST_REQUIRE_MESSAGE(x == expected,
			"\nexpected: " << expected << "\n"
					<< "actual: " << x << "\n");

}